

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

void duckdb::ApproxQuantileOperation::
     Operation<long,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
               (ApproxQuantileState *state,long *input,AggregateUnaryInput *unary_input)

{
  bool bVar1;
  TDigest *this;
  double value;
  
  value = ApproxQuantileCoding::Encode<long,double>(input);
  bVar1 = Value::DoubleIsFinite(value);
  if (bVar1) {
    this = state->h;
    if (this == (TDigest *)0x0) {
      this = (TDigest *)operator_new(0x80);
      duckdb_tdigest::TDigest::TDigest(this,100.0);
      state->h = this;
    }
    duckdb_tdigest::TDigest::add(this,value);
    state->pos = state->pos + 1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto val = ApproxQuantileCoding::template Encode<INPUT_TYPE, SAVE_TYPE>(input);
		if (!Value::DoubleIsFinite(val)) {
			return;
		}
		if (!state.h) {
			state.h = new duckdb_tdigest::TDigest(100);
		}
		state.h->add(val);
		state.pos++;
	}